

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_clear_bindings(sqlite3_stmt *pStmt)

{
  long in_RDI;
  sqlite3_mutex *mutex;
  Vdbe *p;
  int rc;
  int i;
  undefined4 local_c;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x13dc71);
  for (local_c = 0; local_c < *(short *)(in_RDI + 0x20); local_c = local_c + 1) {
    sqlite3VdbeMemRelease((Mem *)0x13dca7);
    *(undefined2 *)(*(long *)(in_RDI + 0x80) + (long)local_c * 0x38 + 0x14) = 1;
  }
  if (*(int *)(in_RDI + 0x11c) != 0) {
    *(ushort *)(in_RDI + 200) = *(ushort *)(in_RDI + 200) & 0xfffc | 1;
  }
  sqlite3_mutex_leave((sqlite3_mutex *)0x13dd05);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_clear_bindings(sqlite3_stmt *pStmt){
  int i;
  int rc = SQLITE_OK;
  Vdbe *p = (Vdbe*)pStmt;
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pStmt==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
#if SQLITE_THREADSAFE
  mutex = p->db->mutex;
#endif
  sqlite3_mutex_enter(mutex);
  for(i=0; i<p->nVar; i++){
    sqlite3VdbeMemRelease(&p->aVar[i]);
    p->aVar[i].flags = MEM_Null;
  }
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask ){
    p->expired = 1;
  }
  sqlite3_mutex_leave(mutex);
  return rc;
}